

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_raytracing_pipeline_handle
          (Impl *this,VkPipeline pipeline,VkPipeline *out_pipeline)

{
  bool bVar1;
  LogLevel LVar2;
  pointer pvVar3;
  VkPipeline_T *pVVar4;
  _Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false> local_30;
  const_iterator itr;
  VkPipeline *out_pipeline_local;
  VkPipeline pipeline_local;
  Impl *this_local;
  
  itr.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>)out_pipeline;
  out_pipeline_local = (VkPipeline *)pipeline;
  pipeline_local = (VkPipeline)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<VkPipeline_T_*,_unsigned_long,_std::hash<VkPipeline_T_*>,_std::equal_to<VkPipeline_T_*>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>_>
       ::find(&this->raytracing_pipeline_to_hash,(key_type *)&out_pipeline_local);
  local_38._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<VkPipeline_T*,unsigned_long,std::hash<VkPipeline_T*>,std::equal_to<VkPipeline_T*>,std::allocator<std::pair<VkPipeline_T*const,unsigned_long>>>>
                 (&this->raytracing_pipeline_to_hash);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    LVar2 = get_thread_log_level();
    if (((int)LVar2 < 2) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Cannot find raytracing pipeline in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                          ), !bVar1)) {
      fprintf(_stderr,
              "Fossilize WARN: Cannot find raytracing pipeline in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
             );
    }
    this_local._7_1_ = false;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<VkPipeline_T_*const,_unsigned_long>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<VkPipeline_T_*const,_unsigned_long>,_false,_false>
                         *)&local_30);
    pVVar4 = api_object_cast<VkPipeline_T*,unsigned_long>(pvVar3->second);
    *(VkPipeline_T **)
     itr.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur =
         pVVar4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_raytracing_pipeline_handle(VkPipeline pipeline, VkPipeline *out_pipeline) const
{
	auto itr = raytracing_pipeline_to_hash.find(pipeline);
	if (itr == end(raytracing_pipeline_to_hash))
	{
		LOGW_LEVEL("Cannot find raytracing pipeline in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_pipeline = api_object_cast<VkPipeline>(uint64_t(itr->second));
		return true;
	}
}